

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_lzw.c
# Opt level: O2

int LZWEncode(TIFF *tif,uint8_t *bp,tmsize_t cc,uint16_t s)

{
  ushort uVar1;
  LZWCodecState *sp;
  uint8_t *puVar2;
  hash_t *phVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  hash_t *phVar14;
  long lVar15;
  uint uVar16;
  byte *pbVar17;
  uint8_t *puVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  uint local_94;
  uint8_t *local_90;
  WordType local_88;
  ulong local_80;
  long local_60;
  
  sp = (LZWCodecState *)tif->tif_data;
  if (sp == (LZWCodecState *)0x0) {
    return 0;
  }
  if (sp->enc_hashtab == (hash_t *)0x0) {
    __assert_fail("sp->enc_hashtab != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                  ,0x46e,"int LZWEncode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
  }
  lVar19 = sp->enc_incount;
  local_80 = sp->enc_outcount;
  local_60 = sp->enc_checkpoint;
  local_88 = (sp->base).nextdata;
  lVar22 = (sp->base).nextbits;
  uVar5 = (uint)(sp->base).free_ent;
  uVar6 = (uint)(sp->base).maxcode;
  uVar1 = (sp->base).nbits;
  uVar13 = (ulong)uVar1;
  local_90 = tif->tif_rawcp;
  puVar2 = sp->enc_rawlimit;
  uVar20 = sp->enc_oldcode;
  local_94 = (uint)uVar1;
  if ((0 < cc) && ((uVar20 & 0xffff) == 0xffff)) {
    local_88 = local_88 << ((byte)uVar1 & 0x3f) | 0x100;
    lVar10 = lVar22 + uVar13 + -8;
    *local_90 = (uint8_t)(local_88 >> ((byte)lVar10 & 0x3f));
    if ((long)(lVar22 + uVar13) < 0x10) {
      local_90 = local_90 + 1;
    }
    else {
      lVar10 = lVar22 + uVar13 + -0x10;
      local_90[1] = (uint8_t)(local_88 >> ((byte)lVar10 & 0x3f));
      local_90 = local_90 + 2;
    }
    uVar20 = (uint)*bp;
    bp = bp + 1;
    cc = cc + -1;
    lVar19 = lVar19 + 1;
    lVar22 = lVar10;
    local_80 = local_80 + uVar13;
  }
LAB_002652f0:
  do {
    lVar10 = lVar19 << 8;
    lVar11 = 0;
    pbVar17 = bp;
    while( true ) {
      lVar10 = lVar10 + 0x100;
      uVar21 = uVar20 & 0xffff;
      if (cc + lVar11 < 1) {
        sp->enc_incount = lVar19 - lVar11;
        sp->enc_outcount = local_80;
        sp->enc_checkpoint = local_60;
        sp->enc_oldcode = uVar21;
        (sp->base).nextdata = local_88;
        (sp->base).nextbits = lVar22;
        (sp->base).free_ent = (hcode_t)uVar5;
        (sp->base).maxcode = (unsigned_short)uVar6;
        (sp->base).nbits = (unsigned_short)local_94;
        tif->tif_rawcp = local_90;
        return 1;
      }
      uVar20 = (uint)*pbVar17;
      lVar15 = (ulong)*pbVar17 * 0x1000 + (ulong)uVar21;
      uVar12 = uVar20 << 5 ^ uVar21;
      phVar3 = sp->enc_hashtab;
      phVar14 = (hash_t *)((long)&phVar3->hash + (ulong)(uVar12 << 4));
      lVar4 = *(long *)((long)&phVar3->hash + (ulong)(uVar12 << 4));
      if (lVar4 != lVar15) break;
      pbVar17 = pbVar17 + 1;
      uVar20 = (uint)phVar14->code;
      lVar11 = lVar11 + -1;
    }
    bp = bp + (1 - lVar11);
    lVar7 = lVar19 - lVar11;
    lVar19 = lVar7 + 1;
    cc = cc + lVar11 + -1;
    if (-1 < lVar4) {
      iVar9 = uVar12 - 0x2329;
      if (uVar20 << 5 == uVar21) {
        iVar9 = -1;
      }
      do {
        uVar16 = uVar12 + iVar9;
        uVar12 = uVar12 + 0x2329 + iVar9;
        if (-1 < (int)uVar16) {
          uVar12 = uVar16;
        }
        phVar14 = phVar3 + (int)uVar12;
        if (phVar3[(int)uVar12].hash == lVar15) {
          uVar20 = (uint)phVar14->code;
          goto LAB_002652f0;
        }
      } while (-1 < phVar3[(int)uVar12].hash);
    }
    if (puVar2 < local_90) {
      tif->tif_rawcc = (long)local_90 - (long)tif->tif_rawdata;
      iVar9 = TIFFFlushData1(tif);
      if (iVar9 == 0) {
        return 0;
      }
      local_90 = tif->tif_rawdata;
    }
    bVar8 = (byte)local_94;
    uVar13 = (ulong)local_94;
    local_88 = local_88 << (bVar8 & 0x3f) | (ulong)uVar21;
    lVar11 = lVar22 + uVar13 + -8;
    *local_90 = (uint8_t)(local_88 >> ((byte)lVar11 & 0x3f));
    if ((long)(lVar22 + uVar13) < 0x10) {
      puVar18 = local_90 + 1;
    }
    else {
      lVar11 = lVar22 + uVar13 + -0x10;
      local_90[1] = (uint8_t)(local_88 >> ((byte)lVar11 & 0x3f));
      puVar18 = local_90 + 2;
    }
    uVar21 = uVar5 + 1;
    phVar14->code = (hcode_t)uVar5;
    phVar14->hash = lVar15;
    if (uVar21 == 0xffe) break;
    local_80 = local_80 + uVar13;
    lVar22 = lVar11;
    local_90 = puVar18;
    if ((int)uVar5 < (int)uVar6) {
      uVar5 = uVar21;
      if (local_60 <= lVar19) {
        if (lVar7 < 0x7fffff) {
          lVar10 = lVar10 / (long)local_80;
        }
        else {
          lVar10 = 0x7fffffff;
          if (0xff < local_80) {
            lVar10 = lVar19 / ((long)local_80 >> 8);
          }
        }
        local_60 = lVar7 + 0x2711;
        if (sp->enc_ratio < lVar10) {
          sp->enc_ratio = lVar10;
        }
        else {
          cl_hash(sp);
          sp->enc_ratio = 0;
          local_88 = local_88 << (bVar8 & 0x3f) | 0x100;
          lVar22 = lVar11 + uVar13 + -8;
          *puVar18 = (uint8_t)(local_88 >> ((byte)lVar22 & 0x3f));
          uVar6 = 0x1ff;
          lVar19 = 0;
          local_94 = 9;
          local_90 = puVar18 + 1;
          local_80 = uVar13;
          uVar5 = 0x102;
          if (0xf < (long)(lVar11 + uVar13)) {
            lVar22 = lVar11 + uVar13 + -0x10;
            puVar18[1] = (uint8_t)(local_88 >> ((byte)lVar22 & 0x3f));
            goto LAB_002656dc;
          }
        }
      }
      goto LAB_002652f0;
    }
    if (0xb < (int)local_94) {
      __assert_fail("nbits <= BITS_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_lzw.c"
                    ,0x4e0,"int LZWEncode(TIFF *, uint8_t *, tmsize_t, uint16_t)");
    }
    local_94 = local_94 + 1;
    uVar6 = ~(uint)(-1L << ((byte)local_94 & 0x3f));
    uVar5 = uVar21;
  } while( true );
  cl_hash(sp);
  sp->enc_ratio = 0;
  local_88 = local_88 << (bVar8 & 0x3f) | 0x100;
  lVar22 = lVar11 + uVar13 + -8;
  *puVar18 = (uint8_t)(local_88 >> ((byte)lVar22 & 0x3f));
  uVar6 = 0x1ff;
  lVar19 = 0;
  local_94 = 9;
  local_90 = puVar18 + 1;
  local_80 = uVar13;
  uVar5 = 0x102;
  if (0xf < (long)(lVar11 + uVar13)) {
    lVar22 = lVar11 + uVar13 + -0x10;
    puVar18[1] = (uint8_t)(local_88 >> ((byte)lVar22 & 0x3f));
LAB_002656dc:
    uVar6 = 0x1ff;
    lVar19 = 0;
    local_94 = 9;
    local_90 = puVar18 + 2;
    local_80 = uVar13;
    uVar5 = 0x102;
  }
  goto LAB_002652f0;
}

Assistant:

static int LZWEncode(TIFF *tif, uint8_t *bp, tmsize_t cc, uint16_t s)
{
    register LZWCodecState *sp = EncoderState(tif);
    register long fcode;
    register hash_t *hp;
    register int h, c;
    hcode_t ent;
    long disp;
    tmsize_t incount, outcount, checkpoint;
    WordType nextdata;
    long nextbits;
    int free_ent, maxcode, nbits;
    uint8_t *op;
    uint8_t *limit;

    (void)s;
    if (sp == NULL)
        return (0);

    assert(sp->enc_hashtab != NULL);

    /*
     * Load local state.
     */
    incount = sp->enc_incount;
    outcount = sp->enc_outcount;
    checkpoint = sp->enc_checkpoint;
    nextdata = sp->lzw_nextdata;
    nextbits = sp->lzw_nextbits;
    free_ent = sp->lzw_free_ent;
    maxcode = sp->lzw_maxcode;
    nbits = sp->lzw_nbits;
    op = tif->tif_rawcp;
    limit = sp->enc_rawlimit;
    ent = (hcode_t)sp->enc_oldcode;

    if (ent == (hcode_t)-1 && cc > 0)
    {
        /*
         * NB: This is safe because it can only happen
         *     at the start of a strip where we know there
         *     is space in the data buffer.
         */
        PutNextCode(op, CODE_CLEAR);
        ent = *bp++;
        cc--;
        incount++;
    }
    while (cc > 0)
    {
        c = *bp++;
        cc--;
        incount++;
        fcode = ((long)c << BITS_MAX) + ent;
        h = (c << HSHIFT) ^ ent; /* xor hashing */
#ifdef _WINDOWS
        /*
         * Check hash index for an overflow.
         */
        if (h >= HSIZE)
            h -= HSIZE;
#endif
        hp = &sp->enc_hashtab[h];
        if (hp->hash == fcode)
        {
            ent = hp->code;
            continue;
        }
        if (hp->hash >= 0)
        {
            /*
             * Primary hash failed, check secondary hash.
             */
            disp = HSIZE - h;
            if (h == 0)
                disp = 1;
            do
            {
                /*
                 * Avoid pointer arithmetic because of
                 * wraparound problems with segments.
                 */
                if ((h -= disp) < 0)
                    h += HSIZE;
                hp = &sp->enc_hashtab[h];
                if (hp->hash == fcode)
                {
                    ent = hp->code;
                    goto hit;
                }
            } while (hp->hash >= 0);
        }
        /*
         * New entry, emit code and add to table.
         */
        /*
         * Verify there is space in the buffer for the code
         * and any potential Clear code that might be emitted
         * below.  The value of limit is setup so that there
         * are at least 4 bytes free--room for 2 codes.
         */
        if (op > limit)
        {
            tif->tif_rawcc = (tmsize_t)(op - tif->tif_rawdata);
            if (!TIFFFlushData1(tif))
                return 0;
            op = tif->tif_rawdata;
        }
        PutNextCode(op, ent);
        ent = (hcode_t)c;
        hp->code = (hcode_t)(free_ent++);
        hp->hash = fcode;
        if (free_ent == CODE_MAX - 1)
        {
            /* table is full, emit clear code and reset */
            cl_hash(sp);
            sp->enc_ratio = 0;
            incount = 0;
            outcount = 0;
            free_ent = CODE_FIRST;
            PutNextCode(op, CODE_CLEAR);
            nbits = BITS_MIN;
            maxcode = MAXCODE(BITS_MIN);
        }
        else
        {
            /*
             * If the next entry is going to be too big for
             * the code size, then increase it, if possible.
             */
            if (free_ent > maxcode)
            {
                nbits++;
                assert(nbits <= BITS_MAX);
                maxcode = (int)MAXCODE(nbits);
            }
            else if (incount >= checkpoint)
            {
                tmsize_t rat;
                /*
                 * Check compression ratio and, if things seem
                 * to be slipping, clear the hash table and
                 * reset state.  The compression ratio is a
                 * 24+8-bit fractional number.
                 */
                checkpoint = incount + CHECK_GAP;
                CALCRATIO(sp, rat);
                if (rat <= sp->enc_ratio)
                {
                    cl_hash(sp);
                    sp->enc_ratio = 0;
                    incount = 0;
                    outcount = 0;
                    free_ent = CODE_FIRST;
                    PutNextCode(op, CODE_CLEAR);
                    nbits = BITS_MIN;
                    maxcode = MAXCODE(BITS_MIN);
                }
                else
                    sp->enc_ratio = rat;
            }
        }
    hit:;
    }

    /*
     * Restore global state.
     */
    sp->enc_incount = incount;
    sp->enc_outcount = outcount;
    sp->enc_checkpoint = checkpoint;
    sp->enc_oldcode = ent;
    sp->lzw_nextdata = nextdata;
    sp->lzw_nextbits = nextbits;
    sp->lzw_free_ent = (unsigned short)free_ent;
    sp->lzw_maxcode = (unsigned short)maxcode;
    sp->lzw_nbits = (unsigned short)nbits;
    tif->tif_rawcp = op;
    return (1);
}